

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  Surface *pSurface;
  string *data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Surface *pSVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  pointer pcVar11;
  aiReturn aVar12;
  int iVar13;
  aiScene *paVar14;
  undefined8 *puVar15;
  size_t sVar16;
  long *plVar17;
  void *pvVar18;
  ostream *poVar19;
  long *plVar20;
  char *pcVar21;
  char *pcVar22;
  long lVar23;
  _Alloc_hider _Var24;
  vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  *this_00;
  ulong uVar25;
  pointer pMVar26;
  string *psVar27;
  pointer pMVar28;
  Property *pProperty;
  long lVar29;
  Material *mat;
  ulong uVar30;
  long lVar31;
  string testName;
  aiString name;
  aiMaterialProperty *prop;
  long local_670;
  ulong *local_660;
  long local_658;
  ulong local_650 [2];
  undefined8 *local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 uStack_628;
  ColladaExporter *local_620;
  Surface *local_618;
  ulong *local_610;
  long local_608;
  ulong local_600 [2];
  long *local_5f0;
  size_t local_5e8;
  long local_5e0;
  long lStack_5d8;
  Surface *local_5d0;
  Surface *local_5c8;
  Surface *local_5c0;
  Surface *local_5b8;
  aiString local_5b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = &this->materials;
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(this_00,(ulong)this->mScene->mNumMaterials);
  paVar14 = this->mScene;
  if (paVar14->mNumMaterials != 0) {
    local_670 = 0;
    lVar31 = 0;
    uVar30 = 0;
    local_620 = this;
    do {
      pSVar4 = (Surface *)paVar14->mMaterials[uVar30];
      local_5b0._0_8_ = local_5b0._0_8_ & 0xffffff0000000000;
      memset((void *)((long)&local_5b0 + 5),0x1b,0x3ff);
      local_618 = pSVar4;
      aVar12 = aiGetMaterialString((aiMaterial *)pSVar4,"?mat.name",0,0,&local_5b0);
      if (aVar12 == aiReturn_SUCCESS) {
        lVar23 = (long)&local_5b0 + 4;
        local_5f0 = &local_5e0;
        sVar16 = strlen((char *)lVar23);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,lVar23,lVar23 + sVar16)
        ;
        sVar16 = local_5e8;
        plVar17 = local_5f0;
        if (uVar30 == 0) {
LAB_006766ea:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pcVar22 = (char *)pMVar26[uVar30].name._M_string_length;
          strlen((char *)((long)&local_5b0 + 4));
          std::__cxx11::string::_M_replace((ulong)(pMVar26 + uVar30),0,pcVar22,(long)&local_5b0 + 4)
          ;
        }
        else {
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar23 = 0;
          lVar29 = 0;
          do {
            if (*(size_t *)((long)&(pMVar26->name)._M_string_length + lVar23) == sVar16) {
              if (sVar16 == 0) {
                lVar29 = lVar29 + 1;
              }
              else {
                iVar13 = bcmp(*(void **)((long)&(pMVar26->name)._M_dataplus._M_p + lVar23),plVar17,
                              sVar16);
                lVar29 = lVar29 + (ulong)(iVar13 == 0);
              }
            }
            this = local_620;
            lVar23 = lVar23 + 0x218;
          } while (local_670 != lVar23);
          if (lVar29 == 0) goto LAB_006766ea;
          local_660 = local_650;
          lVar23 = (long)&local_5b0 + 4;
          sVar16 = strlen((char *)lVar23);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_660,lVar23,lVar23 + sVar16);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar25 = 0xf;
          if (local_660 != local_650) {
            uVar25 = local_650[0];
          }
          if (uVar25 < (ulong)(local_608 + local_658)) {
            uVar25 = 0xf;
            if (local_610 != local_600) {
              uVar25 = local_600[0];
            }
            if (uVar25 < (ulong)(local_608 + local_658)) goto LAB_006766db;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_610,0,(char *)0x0,(ulong)local_660);
          }
          else {
LAB_006766db:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_610);
          }
          puVar1 = puVar15 + 2;
          if ((undefined8 *)*puVar15 == puVar1) {
            local_630 = *puVar1;
            uStack_628 = puVar15[3];
            local_640 = &local_630;
          }
          else {
            local_630 = *puVar1;
            local_640 = (undefined8 *)*puVar15;
          }
          local_638 = puVar15[1];
          *puVar15 = puVar1;
          puVar15[1] = 0;
          *(undefined1 *)puVar1 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     ((this_00->
                      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar30),(string *)&local_640);
          if (local_640 != &local_630) {
            operator_delete(local_640);
          }
          if (local_610 != local_600) {
            operator_delete(local_610);
          }
          if (local_660 != local_650) {
            operator_delete(local_660);
          }
        }
        if (local_5f0 != &local_5e0) {
          operator_delete(local_5f0);
        }
      }
      else {
        local_5b0._0_8_ = (char *)0x74616d00000003;
        local_660 = local_650;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"m","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar25 = 0xf;
        if (local_660 != local_650) {
          uVar25 = local_650[0];
        }
        if (uVar25 < (ulong)(local_608 + local_658)) {
          uVar25 = 0xf;
          if (local_610 != local_600) {
            uVar25 = local_600[0];
          }
          if (uVar25 < (ulong)(local_608 + local_658)) goto LAB_00676547;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_610,0,(char *)0x0,(ulong)local_660);
        }
        else {
LAB_00676547:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_610);
        }
        puVar1 = puVar15 + 2;
        if ((undefined8 *)*puVar15 == puVar1) {
          local_630 = *puVar1;
          uStack_628 = puVar15[3];
          local_640 = &local_630;
        }
        else {
          local_630 = *puVar1;
          local_640 = (undefined8 *)*puVar15;
        }
        local_638 = puVar15[1];
        *puVar15 = puVar1;
        puVar15[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_640);
        plVar20 = plVar17 + 2;
        if ((long *)*plVar17 == plVar20) {
          local_5e0 = *plVar20;
          lStack_5d8 = plVar17[3];
          local_5f0 = &local_5e0;
        }
        else {
          local_5e0 = *plVar20;
          local_5f0 = (long *)*plVar17;
        }
        local_5e8 = plVar17[1];
        *plVar17 = (long)plVar20;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar30),(string *)&local_5f0);
        if (local_5f0 != &local_5e0) {
          operator_delete(local_5f0);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640);
        }
        if (local_610 != local_600) {
          operator_delete(local_610);
        }
        if (local_660 != local_650) {
          operator_delete(local_660);
        }
      }
      pMVar28 = (this_00->
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar26 = pMVar28 + uVar30;
      if (pMVar28[uVar30].name._M_string_length != 0) {
        _Var24._M_p = (pMVar26->name)._M_dataplus._M_p;
        do {
          pvVar18 = memchr("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",
                           (int)*_Var24._M_p,0x3f);
          if (pvVar18 == (void *)0x0) {
            *_Var24._M_p = '_';
            pMVar28 = (this_00->
                      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          _Var24._M_p = _Var24._M_p + 1;
        } while (_Var24._M_p !=
                 pMVar28[uVar30].name._M_dataplus._M_p + pMVar28[uVar30].name._M_string_length);
        pMVar26 = pMVar28 + uVar30;
        this = local_620;
      }
      std::__cxx11::string::_M_replace
                ((ulong)&pMVar26->shading_model,0,(char *)(pMVar26->shading_model)._M_string_length,
                 0x78b49a);
      aVar12 = aiGetMaterialProperty
                         ((aiMaterial *)local_618,"$mat.shadingm",0,0,
                          (aiMaterialProperty **)local_1a8);
      if (((aVar12 == aiReturn_SUCCESS) && (3 < *(uint *)(local_1a8[0]._M_dataplus._M_p + 0x40c)))
         && (*(int *)(local_1a8[0]._M_dataplus._M_p + 0x410) == 5)) {
        switch(**(undefined4 **)(local_1a8[0]._M_dataplus._M_p + 0x418)) {
        case 2:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar26[uVar30].shading_model;
          pcVar22 = (char *)pMVar26[uVar30].shading_model._M_string_length;
          pcVar21 = "lambert";
          break;
        case 3:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar26[uVar30].shading_model;
          pcVar22 = (char *)pMVar26[uVar30].shading_model._M_string_length;
          pcVar21 = "phong";
          break;
        case 4:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar26[uVar30].shading_model;
          pcVar22 = (char *)pMVar26[uVar30].shading_model._M_string_length;
          pcVar21 = "blinn";
          break;
        default:
          goto switchD_006769f8_caseD_5;
        case 9:
          pMVar26 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar26[uVar30].shading_model;
          pcVar22 = (char *)pMVar26[uVar30].shading_model._M_string_length;
          pcVar21 = "constant";
        }
        std::__cxx11::string::_M_replace((ulong)psVar27,0,pcVar22,(ulong)pcVar21);
      }
switchD_006769f8_caseD_5:
      pSVar4 = local_618;
      ReadMaterialSurface(this,&(this->materials).
                                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar30].ambient,
                          (aiMaterial *)local_618,aiTextureType_AMBIENT,"$clr.ambient",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pMVar26[uVar30].ambient.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar30].diffuse,(aiMaterial *)pSVar4,aiTextureType_DIFFUSE,
                          "$clr.diffuse",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar6 = pMVar26[uVar30].diffuse.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar30].specular,(aiMaterial *)pSVar4,aiTextureType_SPECULAR
                          ,"$clr.specular",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar7 = pMVar26[uVar30].specular.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar30].emissive,(aiMaterial *)pSVar4,aiTextureType_EMISSIVE
                          ,"$clr.emissive",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar8 = pMVar26[uVar30].emissive.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar30].reflective,(aiMaterial *)pSVar4,
                          aiTextureType_REFLECTION,"$clr.reflective",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar9 = pMVar26[uVar30].reflective.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar30].transparent,(aiMaterial *)pSVar4,
                          aiTextureType_OPACITY,"$clr.transparent",0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar10 = pMVar26[uVar30].transparent.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar26[uVar30].normal,(aiMaterial *)pSVar4,aiTextureType_NORMALS,
                          (char *)0x0,0,0);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar31 = (((((((lVar31 - (ulong)(sVar5 == 0)) - (ulong)(sVar6 == 0)) - (ulong)(sVar7 == 0)) -
                  (ulong)(sVar8 == 0)) - (ulong)(sVar9 == 0)) - (ulong)(sVar10 == 0)) + 7) -
               (ulong)(pMVar26[uVar30].normal.texture._M_string_length == 0);
      aVar12 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar4,"$mat.shininess",0,0,&pMVar26[uVar30].shininess.value
                          ,(uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar30].shininess.exist = aVar12 == aiReturn_SUCCESS
      ;
      aVar12 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar4,"$mat.opacity",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar30].transparency.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar30].transparency.exist =
           aVar12 == aiReturn_SUCCESS;
      aVar12 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar4,"$mat.refracti",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar30].index_refraction.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar30].index_refraction.exist =
           aVar12 == aiReturn_SUCCESS;
      uVar30 = uVar30 + 1;
      paVar14 = this->mScene;
      local_670 = local_670 + 0x218;
    } while (uVar30 < paVar14->mNumMaterials);
    if (lVar31 != 0) {
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<library_images>",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      std::__cxx11::string::append((char *)&this->startstr);
      pMVar26 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar26 !=
          (this->materials).
          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        puVar15 = (undefined8 *)(local_5b0.data + 0xc);
        do {
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->ambient,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->diffuse,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->specular,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->emissive,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->reflective,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->transparent,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pcVar11 = (pMVar26->name)._M_dataplus._M_p;
          local_5b0._0_8_ = puVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_5b0,pcVar11,pcVar11 + (pMVar26->name)._M_string_length);
          std::__cxx11::string::append((char *)&local_5b0);
          WriteImageEntry(this,&pMVar26->normal,(string *)&local_5b0);
          if ((undefined8 *)local_5b0._0_8_ != puVar15) {
            operator_delete((void *)local_5b0._0_8_);
          }
          pMVar26 = pMVar26 + 1;
        } while (pMVar26 !=
                 (this->materials).
                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      PopTag(this);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</library_images>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
  }
  if ((this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar2 = &this->field_0x38;
    psVar27 = &this->startstr;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<library_effects>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar27);
    pMVar26 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar26 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pProperty = &pMVar26->index_refraction;
      do {
        data = (string *)(pProperty + -0x42);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<effect id=\"",0xc);
        XMLEscape((string *)&local_5b0,data);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_5b0._0_8_,local_5b0.data._4_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"-fx\" name=\"",0xb);
        XMLEscape(local_1a8,data);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        std::__cxx11::string::append((char *)psVar27);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<profile_COMMON>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar27);
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"emission","");
        local_618 = (Surface *)(pProperty + -0x22);
        WriteTextureParamEntry(this,local_618,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"ambient","");
        WriteTextureParamEntry(this,(Surface *)(pProperty + -0x3a),(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"diffuse","");
        local_620 = (ColladaExporter *)(pProperty + -0x32);
        WriteTextureParamEntry(this,(Surface *)local_620,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"specular","");
        local_5b8 = (Surface *)(pProperty + -0x2a);
        WriteTextureParamEntry(this,local_5b8,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"reflective","");
        local_5c0 = (Surface *)(pProperty + -0x1a);
        WriteTextureParamEntry(this,local_5c0,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"transparent","");
        pSVar4 = (Surface *)(pProperty + -0x12);
        WriteTextureParamEntry(this,pSVar4,(string *)&local_5b0,data);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"normal","");
        pSurface = (Surface *)(pProperty + -10);
        WriteTextureParamEntry(this,pSurface,(string *)&local_5b0,data);
        local_5d0 = pSurface;
        local_5c8 = pSVar4;
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,"<technique sid=\"standard\">",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar27);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<",1);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar27);
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"emission","");
        paVar3 = &local_1a8[0].field_2;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_618,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"ambient","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,(Surface *)(pProperty + -0x3a),(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"diffuse","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,(Surface *)local_620,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"specular","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5b8,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"shininess","");
        WriteFloatEntry(this,pProperty + -2,(string *)&local_5b0);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"reflective","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5c0,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"transparent","");
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_1a8);
        WriteTextureColorEntry(this,local_5c8,(string *)&local_5b0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"transparency","");
        WriteFloatEntry(this,pProperty + -1,(string *)&local_5b0);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        local_5b0._0_8_ = local_5b0.data + 0xc;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5b0,"index_of_refraction","");
        WriteFloatEntry(this,pProperty,(string *)&local_5b0);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        if (pProperty[-6] != (Property)0x0) {
          local_5b0._0_8_ = local_5b0.data + 0xc;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"bump","");
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pProperty[-0x42],
                     (long)pProperty[-0x41] + (long)pProperty[-0x42]);
          std::__cxx11::string::append((char *)local_1a8);
          WriteTextureColorEntry(this,local_5d0,(string *)&local_5b0,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
          if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
            operator_delete((void *)local_5b0._0_8_);
          }
        }
        PopTag(this);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</",2);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</technique>",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</profile_COMMON>",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</effect>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar26 = (pointer)(pProperty + 1);
        pProperty = pProperty + 0x43;
      } while (pMVar26 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</library_effects>",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<library_materials>",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar27);
    pMVar26 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar26 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<material id=\"",0xe);
        XMLEscape((string *)&local_5b0,&pMVar26->name);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_5b0._0_8_,local_5b0.data._4_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\" name=\"",8);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(pMVar26->name)._M_dataplus._M_p,
                             (pMVar26->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        std::__cxx11::string::append((char *)psVar27);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"<instance_effect url=\"#",0x17);
        XMLEscape((string *)&local_5b0,&pMVar26->name);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar19,(char *)local_5b0._0_8_,local_5b0.data._4_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"-fx\"/>",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((char *)local_5b0._0_8_ != local_5b0.data + 0xc) {
          operator_delete((void *)local_5b0._0_8_);
        }
        PopTag(this);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</material>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar26 = pMVar26 + 1;
      } while (pMVar26 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar2,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"</library_materials>",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }
    for( std::string::iterator it = materials[a].name.begin(); it != materials[a].name.end(); ++it ) {
      if( !isalnum_C( *it ) ) {
        *it = '_';
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLEscape(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLEscape(mat.name) << "\" name=\"" << mat.name << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLEscape(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}